

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStyle::ScaleAllSizes(ImGuiStyle *this,float scale_factor)

{
  float fVar1;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c;
  ImVec2 local_24;
  ImVec2 local_1c;
  float local_14;
  ImGuiStyle *pIStack_10;
  float scale_factor_local;
  ImGuiStyle *this_local;
  
  local_14 = scale_factor;
  pIStack_10 = this;
  local_24 = operator*(&this->WindowPadding,scale_factor);
  local_1c = ImFloor(&local_24);
  this->WindowPadding = local_1c;
  fVar1 = ImFloor(this->WindowRounding * local_14);
  this->WindowRounding = fVar1;
  local_34 = operator*(&this->WindowMinSize,local_14);
  local_2c = ImFloor(&local_34);
  this->WindowMinSize = local_2c;
  fVar1 = ImFloor(this->ChildRounding * local_14);
  this->ChildRounding = fVar1;
  fVar1 = ImFloor(this->PopupRounding * local_14);
  this->PopupRounding = fVar1;
  local_44 = operator*(&this->FramePadding,local_14);
  local_3c = ImFloor(&local_44);
  this->FramePadding = local_3c;
  fVar1 = ImFloor(this->FrameRounding * local_14);
  this->FrameRounding = fVar1;
  local_54 = operator*(&this->ItemSpacing,local_14);
  local_4c = ImFloor(&local_54);
  this->ItemSpacing = local_4c;
  local_64 = operator*(&this->ItemInnerSpacing,local_14);
  local_5c = ImFloor(&local_64);
  this->ItemInnerSpacing = local_5c;
  local_74 = operator*(&this->TouchExtraPadding,local_14);
  local_6c = ImFloor(&local_74);
  this->TouchExtraPadding = local_6c;
  fVar1 = ImFloor(this->IndentSpacing * local_14);
  this->IndentSpacing = fVar1;
  fVar1 = ImFloor(this->ColumnsMinSpacing * local_14);
  this->ColumnsMinSpacing = fVar1;
  fVar1 = ImFloor(this->ScrollbarSize * local_14);
  this->ScrollbarSize = fVar1;
  fVar1 = ImFloor(this->ScrollbarRounding * local_14);
  this->ScrollbarRounding = fVar1;
  fVar1 = ImFloor(this->GrabMinSize * local_14);
  this->GrabMinSize = fVar1;
  fVar1 = ImFloor(this->GrabRounding * local_14);
  this->GrabRounding = fVar1;
  fVar1 = ImFloor(this->TabRounding * local_14);
  this->TabRounding = fVar1;
  if ((this->TabMinWidthForUnselectedCloseButton != 3.4028235e+38) ||
     (NAN(this->TabMinWidthForUnselectedCloseButton))) {
    fVar1 = ImFloor(this->TabMinWidthForUnselectedCloseButton * local_14);
    this->TabMinWidthForUnselectedCloseButton = fVar1;
  }
  local_84 = operator*(&this->DisplayWindowPadding,local_14);
  local_7c = ImFloor(&local_84);
  this->DisplayWindowPadding = local_7c;
  local_94 = operator*(&this->DisplaySafeAreaPadding,local_14);
  local_8c = ImFloor(&local_94);
  this->DisplaySafeAreaPadding = local_8c;
  fVar1 = ImFloor(this->MouseCursorScale * local_14);
  this->MouseCursorScale = fVar1;
  return;
}

Assistant:

void ImGuiStyle::ScaleAllSizes(float scale_factor)
{
    WindowPadding = ImFloor(WindowPadding * scale_factor);
    WindowRounding = ImFloor(WindowRounding * scale_factor);
    WindowMinSize = ImFloor(WindowMinSize * scale_factor);
    ChildRounding = ImFloor(ChildRounding * scale_factor);
    PopupRounding = ImFloor(PopupRounding * scale_factor);
    FramePadding = ImFloor(FramePadding * scale_factor);
    FrameRounding = ImFloor(FrameRounding * scale_factor);
    ItemSpacing = ImFloor(ItemSpacing * scale_factor);
    ItemInnerSpacing = ImFloor(ItemInnerSpacing * scale_factor);
    TouchExtraPadding = ImFloor(TouchExtraPadding * scale_factor);
    IndentSpacing = ImFloor(IndentSpacing * scale_factor);
    ColumnsMinSpacing = ImFloor(ColumnsMinSpacing * scale_factor);
    ScrollbarSize = ImFloor(ScrollbarSize * scale_factor);
    ScrollbarRounding = ImFloor(ScrollbarRounding * scale_factor);
    GrabMinSize = ImFloor(GrabMinSize * scale_factor);
    GrabRounding = ImFloor(GrabRounding * scale_factor);
    TabRounding = ImFloor(TabRounding * scale_factor);
    if (TabMinWidthForUnselectedCloseButton != FLT_MAX)
        TabMinWidthForUnselectedCloseButton = ImFloor(TabMinWidthForUnselectedCloseButton * scale_factor);
    DisplayWindowPadding = ImFloor(DisplayWindowPadding * scale_factor);
    DisplaySafeAreaPadding = ImFloor(DisplaySafeAreaPadding * scale_factor);
    MouseCursorScale = ImFloor(MouseCursorScale * scale_factor);
}